

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

char ctemplate_htmlparser::jsparser_buffer_get(jsparser_ctx *js,int pos)

{
  int iVar1;
  int absolute_pos;
  int pos_local;
  jsparser_ctx *js_local;
  
  if (pos < 0) {
    iVar1 = jsparser_buffer_absolute_pos(js,pos);
    if (iVar1 < 0) {
      js_local._7_1_ = '\0';
    }
    else {
      js_local._7_1_ = js->buffer[iVar1];
    }
    return js_local._7_1_;
  }
  __assert_fail("pos < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,0x106,"char ctemplate_htmlparser::jsparser_buffer_get(jsparser_ctx *, int)");
}

Assistant:

char jsparser_buffer_get(jsparser_ctx *js, int pos)
{
  int absolute_pos;
  assert(pos < 0);

  absolute_pos = jsparser_buffer_absolute_pos(js, pos);
  if (absolute_pos < 0) {
    return '\0';
  }

  return js->buffer[absolute_pos];
}